

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib530.c
# Opt level: O3

int test(char *URL)

{
  long *plVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  timeval tVar13;
  int running;
  CURL *curl [4];
  fd_set rd;
  fd_set exc;
  fd_set wr;
  char target_url [256];
  int local_2f0;
  int local_2ec;
  timeval local_2e8;
  long local_2d8 [4];
  fd_set local_2b8;
  fd_set local_238;
  fd_set local_1b8;
  undefined1 local_138 [255];
  undefined1 local_39;
  
  local_2d8[0] = 0;
  local_2d8[1] = 0;
  local_2d8[2] = 0;
  local_2d8[3] = 0;
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib530.c"
                  ,0x2f,iVar2,uVar3);
    goto LAB_001027d9;
  }
  lVar4 = curl_multi_init();
  if (lVar4 != 0) {
    lVar12 = 0;
    do {
      if (lVar12 == 4) {
        iVar2 = curl_multi_add_handle(lVar4,local_2d8[0]);
        uVar8 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uVar7 = 0x44;
          goto LAB_0010279b;
        }
        iVar2 = curl_multi_setopt(lVar4,3,1);
        uVar8 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar9 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
          uVar7 = 0x46;
          goto LAB_0010279b;
        }
        curl_mfprintf(_stderr,"Start at URL 0\n");
        local_2f0 = -99;
        local_2e8.tv_sec = 1;
        local_2e8.tv_usec = 0;
        iVar2 = curl_multi_perform(lVar4,&local_2ec);
        if (iVar2 != 0) goto LAB_0010255b;
        uVar10 = 1;
        goto LAB_00102599;
      }
      lVar5 = curl_easy_init();
      local_2d8[lVar12] = lVar5;
      if (lVar5 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib530.c"
                      ,0x36);
        iVar2 = 0x7c;
        goto LAB_001027a8;
      }
      curl_msnprintf(local_138,0x100,"%s%04i",URL,(int)lVar12 + 1);
      local_39 = 0;
      iVar2 = curl_easy_setopt(lVar5,0x2712,local_138);
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar7 = 0x3a;
        goto LAB_0010279b;
      }
      iVar2 = curl_easy_setopt(lVar5,0x29,1);
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uVar7 = 0x3c;
        goto LAB_0010279b;
      }
      iVar2 = curl_easy_setopt(lVar5,0x2a,1);
      uVar8 = _stderr;
      lVar12 = lVar12 + 1;
    } while (iVar2 == 0);
    uVar3 = curl_easy_strerror(iVar2);
    pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
    uVar7 = 0x3e;
    goto LAB_0010279b;
  }
  curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib530.c"
                ,0x31);
  iVar2 = 0x7b;
  goto LAB_001027a8;
  while( true ) {
    if (local_2ec == 0) {
      if (3 < uVar10) {
        iVar2 = 0;
        goto LAB_001027a8;
      }
      uVar11 = (ulong)uVar10;
      while (uVar11 != 4) {
        plVar1 = local_2d8 + uVar11;
        uVar11 = uVar11 + 1;
        iVar2 = curl_multi_add_handle(lVar4,*plVar1);
        uVar8 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
          uVar7 = 0x5d;
          goto LAB_0010279b;
        }
      }
      uVar10 = 4;
    }
    local_2b8.__fds_bits[0xe] = 0;
    local_2b8.__fds_bits[0xf] = 0;
    local_2b8.__fds_bits[0xc] = 0;
    local_2b8.__fds_bits[0xd] = 0;
    local_2b8.__fds_bits[10] = 0;
    local_2b8.__fds_bits[0xb] = 0;
    local_2b8.__fds_bits[8] = 0;
    local_2b8.__fds_bits[9] = 0;
    local_2b8.__fds_bits[6] = 0;
    local_2b8.__fds_bits[7] = 0;
    local_2b8.__fds_bits[4] = 0;
    local_2b8.__fds_bits[5] = 0;
    local_2b8.__fds_bits[2] = 0;
    local_2b8.__fds_bits[3] = 0;
    local_2b8.__fds_bits[0] = 0;
    local_2b8.__fds_bits[1] = 0;
    local_1b8.__fds_bits[0] = 0;
    local_1b8.__fds_bits[1] = 0;
    local_1b8.__fds_bits[2] = 0;
    local_1b8.__fds_bits[3] = 0;
    local_1b8.__fds_bits[4] = 0;
    local_1b8.__fds_bits[5] = 0;
    local_1b8.__fds_bits[6] = 0;
    local_1b8.__fds_bits[7] = 0;
    local_1b8.__fds_bits[8] = 0;
    local_1b8.__fds_bits[9] = 0;
    local_1b8.__fds_bits[10] = 0;
    local_1b8.__fds_bits[0xb] = 0;
    local_1b8.__fds_bits[0xc] = 0;
    local_1b8.__fds_bits[0xd] = 0;
    local_1b8.__fds_bits[0xe] = 0;
    local_1b8.__fds_bits[0xf] = 0;
    local_238.__fds_bits[0] = 0;
    local_238.__fds_bits[1] = 0;
    local_238.__fds_bits[2] = 0;
    local_238.__fds_bits[3] = 0;
    local_238.__fds_bits[4] = 0;
    local_238.__fds_bits[5] = 0;
    local_238.__fds_bits[6] = 0;
    local_238.__fds_bits[7] = 0;
    local_238.__fds_bits[8] = 0;
    local_238.__fds_bits[9] = 0;
    local_238.__fds_bits[10] = 0;
    local_238.__fds_bits[0xb] = 0;
    local_238.__fds_bits[0xc] = 0;
    local_238.__fds_bits[0xd] = 0;
    local_238.__fds_bits[0xe] = 0;
    local_238.__fds_bits[0xf] = 0;
    iVar2 = curl_multi_fdset(lVar4,&local_2b8,&local_1b8,&local_238,&local_2f0);
    uVar8 = _stderr;
    if (iVar2 != 0) {
      uVar3 = curl_multi_strerror(iVar2);
      pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
      uVar7 = 100;
      goto LAB_0010279b;
    }
    if (local_2f0 < -1) {
      pcVar9 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
      uVar8 = 100;
      goto LAB_00102861;
    }
    iVar2 = select_wrapper(local_2f0 + 1,&local_2b8,&local_1b8,&local_238,&local_2e8);
    if (iVar2 == -1) {
      piVar6 = __errno_location();
      uVar8 = _stderr;
      iVar2 = *piVar6;
      pcVar9 = strerror(iVar2);
      curl_mfprintf(uVar8,"%s:%d select() failed, with errno %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib530.c"
                    ,0x68,iVar2,pcVar9);
      iVar2 = 0x79;
      goto LAB_001027a8;
    }
    tVar13 = tutil_tvnow();
    lVar12 = tutil_tvdiff(tVar13,tv_test_start);
    if (60000 < lVar12) {
      uVar8 = 0x6a;
      goto LAB_001028c8;
    }
    local_2f0 = -99;
    local_2e8.tv_sec = 1;
    local_2e8.tv_usec = 0;
    iVar2 = curl_multi_perform(lVar4,&local_2ec);
    if (iVar2 != 0) break;
LAB_00102599:
    if (local_2ec < 0) {
      pcVar9 = 
      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
      uVar8 = 0x52;
LAB_00102861:
      curl_mfprintf(_stderr,pcVar9,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib530.c"
                    ,uVar8);
      iVar2 = 0x7a;
      goto LAB_001027a8;
    }
    tVar13 = tutil_tvnow();
    lVar12 = tutil_tvdiff(tVar13,tv_test_start);
    if (60000 < lVar12) {
      uVar8 = 0x54;
LAB_001028c8:
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib530.c"
                    ,uVar8);
      iVar2 = 0x7d;
      goto LAB_001027a8;
    }
  }
LAB_0010255b:
  uVar8 = _stderr;
  uVar3 = curl_multi_strerror(iVar2);
  pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
  uVar7 = 0x52;
LAB_0010279b:
  curl_mfprintf(uVar8,pcVar9,
                "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib530.c"
                ,uVar7,iVar2,uVar3);
LAB_001027a8:
  lVar12 = 0;
  do {
    lVar5 = local_2d8[lVar12];
    curl_multi_remove_handle(lVar4,lVar5);
    curl_easy_cleanup(lVar5);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  curl_multi_cleanup(lVar4);
  curl_global_cleanup();
LAB_001027d9:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];
  int handles_added = 0;

  for(i = 0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    snprintf(target_url, sizeof(target_url), "%s%04i", URL, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);
  }

  /* Add the first handle to multi. We do this to let libcurl detect
     that the server can do pipelining. The rest of the handles will be
     added later. */
  multi_add_handle(m, curl[handles_added++]);

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
      if(handles_added >= NUM_HANDLES)
        break; /* done */

      /* Add the rest of the handles now that the first handle has completed
         its request. */
      while(handles_added < NUM_HANDLES)
        multi_add_handle(m, curl[handles_added++]);
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}